

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

bool __thiscall cmCTest::InitializeFromCommand(cmCTest *this,cmCTestStartCommand *command)

{
  cmMakefile *this_00;
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  char *__nptr;
  size_t sVar5;
  long lVar6;
  string fname;
  string bld_dir_fname;
  string src_dir_fname;
  string bld_dir;
  ostringstream cmCTestLog_msg;
  string src_dir;
  string local_288;
  char *local_268;
  long local_260;
  char local_258;
  undefined7 uStack_257;
  string local_248;
  string local_228;
  long *local_208;
  long local_200;
  long local_1f8 [2];
  string local_1e8;
  undefined1 local_1c8 [112];
  ios_base local_158 [264];
  string local_50;
  
  pcVar1 = local_1c8 + 0x10;
  local_1c8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"SourceDirectory","");
  GetCTestConfiguration(&local_50,this,(string *)local_1c8);
  if ((pointer)local_1c8._0_8_ != pcVar1) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  local_1c8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"BuildDirectory","");
  GetCTestConfiguration(&local_1e8,this,(string *)local_1c8);
  if ((pointer)local_1c8._0_8_ != pcVar1) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  this->DartVersion = 1;
  this->DropSiteCDash = false;
  lVar6 = 0x130;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&this->RepeatTests + lVar6),
                      *(pointer *)((long)&this->RepeatTests + lVar6));
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0x3f0);
  this_00 = (command->super_cmCTestCommand).super_cmCommand.Makefile;
  local_268 = &local_258;
  local_260 = 0;
  local_258 = '\0';
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_228,local_50._M_dataplus._M_p,
             local_50._M_dataplus._M_p + local_50._M_string_length);
  std::__cxx11::string::append((char *)&local_228);
  cmsys::SystemTools::ConvertToUnixSlashes(&local_228);
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_248,local_1e8._M_dataplus._M_p,
             local_1e8._M_dataplus._M_p + local_1e8._M_string_length);
  std::__cxx11::string::append((char *)&local_248);
  cmsys::SystemTools::ConvertToUnixSlashes(&local_248);
  bVar2 = cmsys::SystemTools::FileExists(local_248._M_dataplus._M_p);
  if ((bVar2) || (bVar2 = cmsys::SystemTools::FileExists(local_228._M_dataplus._M_p), bVar2)) {
    std::__cxx11::string::_M_assign((string *)&local_268);
  }
  if (local_260 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"Cannot locate CTest configuration: in BuildDirectory: ",0x36);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c8,local_248._M_dataplus._M_p,local_248._M_string_length);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,5,
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
        ,0x2c6,local_288._M_dataplus._M_p,command->Quiet);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
    std::ios_base::~ios_base(local_158);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"Cannot locate CTest configuration: in SourceDirectory: ",0x37);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c8,local_228._M_dataplus._M_p,local_228._M_string_length);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,5,
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
        ,0x2c9,local_288._M_dataplus._M_p,command->Quiet);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
    std::ios_base::~ios_base(local_158);
LAB_0025d447:
    local_1c8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c8,"CTEST_NIGHTLY_START_TIME","");
    SetCTestConfigurationFromCMakeVariable
              (this,this_00,"NightlyStartTime",(string *)local_1c8,command->Quiet);
    if ((pointer)local_1c8._0_8_ != pcVar1) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
    local_1c8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"CTEST_SITE","");
    SetCTestConfigurationFromCMakeVariable(this,this_00,"Site",(string *)local_1c8,command->Quiet);
    if ((pointer)local_1c8._0_8_ != pcVar1) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
    local_1c8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"CTEST_BUILD_NAME","");
    SetCTestConfigurationFromCMakeVariable
              (this,this_00,"BuildName",(string *)local_1c8,command->Quiet);
    if ((pointer)local_1c8._0_8_ != pcVar1) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
    local_1c8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c8,"CTEST_DART_SERVER_VERSION","");
    __nptr = cmMakefile::GetDefinition(this_00,(string *)local_1c8);
    if ((pointer)local_1c8._0_8_ != pcVar1) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
    if (__nptr != (char *)0x0) {
      iVar3 = atoi(__nptr);
      this->DartVersion = iVar3;
      if (iVar3 < 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1c8,"Invalid Dart server version: ",0x1d);
        sVar5 = strlen(__nptr);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,__nptr,sVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1c8,". Please specify the version number.",0x24);
        std::ios::widen((char)(ostream *)local_1c8 + (char)*(undefined8 *)(local_1c8._0_8_ + -0x18))
        ;
        std::ostream::put((char)local_1c8);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(this,6,
            "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
            ,0x2da,local_288._M_dataplus._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
        std::ios_base::~ios_base(local_158);
        goto LAB_0025d89a;
      }
    }
    local_1c8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"CTEST_DROP_SITE_CDASH","");
    bVar2 = cmMakefile::IsOn(this_00,(string *)local_1c8);
    this->DropSiteCDash = bVar2;
    if ((pointer)local_1c8._0_8_ != pcVar1) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
    iVar3 = Initialize(this,local_1e8._M_dataplus._M_p,command);
    if (iVar3 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"   Use ",7);
      GetTestModelString_abi_cxx11_(&local_288,this);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1c8,local_288._M_dataplus._M_p,local_288._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," tag: ",6);
      pcVar1 = (this->CurrentTag)._M_dataplus._M_p;
      local_208 = local_1f8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_208,pcVar1,pcVar1 + (this->CurrentTag)._M_string_length);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(char *)local_208,local_200);
      std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      if (local_208 != local_1f8) {
        operator_delete(local_208,local_1f8[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringbuf::str();
      Log(this,1,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
          ,0x2e6,local_288._M_dataplus._M_p,command->Quiet);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
      std::ios_base::~ios_base(local_158);
      bVar2 = true;
      goto LAB_0025d89c;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"   Reading ctest configuration file: ",0x25);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c8,local_268,local_260);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,1,
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
        ,0x2b8,local_288._M_dataplus._M_p,command->Quiet);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
    std::ios_base::~ios_base(local_158);
    bVar2 = cmMakefile::ReadDependentFile(this_00,local_268,true);
    if (bVar2) goto LAB_0025d447;
    local_1c8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c8,"Could not find include file: ","");
    std::__cxx11::string::_M_append(local_1c8,(ulong)local_268);
    cmCommand::SetError((cmCommand *)command,(string *)local_1c8);
    if ((pointer)local_1c8._0_8_ != pcVar1) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
    if (bVar2) goto LAB_0025d447;
  }
LAB_0025d89a:
  bVar2 = false;
LAB_0025d89c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if (local_268 != &local_258) {
    operator_delete(local_268,CONCAT71(uStack_257,local_258) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool cmCTest::InitializeFromCommand(cmCTestStartCommand* command)
{
  std::string src_dir
    = this->GetCTestConfiguration("SourceDirectory");
  std::string bld_dir = this->GetCTestConfiguration("BuildDirectory");
  this->DartVersion = 1;
  this->DropSiteCDash = false;
  for(Part p = PartStart; p != PartCount; p = Part(p+1))
    {
    this->Parts[p].SubmitFiles.clear();
    }

  cmMakefile* mf = command->GetMakefile();
  std::string fname;

  std::string src_dir_fname = src_dir;
  src_dir_fname += "/CTestConfig.cmake";
  cmSystemTools::ConvertToUnixSlashes(src_dir_fname);

  std::string bld_dir_fname = bld_dir;
  bld_dir_fname += "/CTestConfig.cmake";
  cmSystemTools::ConvertToUnixSlashes(bld_dir_fname);

  if ( cmSystemTools::FileExists(bld_dir_fname.c_str()) )
    {
    fname = bld_dir_fname;
    }
  else if ( cmSystemTools::FileExists(src_dir_fname.c_str()) )
    {
    fname = src_dir_fname;
    }

  if ( !fname.empty() )
    {
    cmCTestOptionalLog(this, OUTPUT, "   Reading ctest configuration file: "
      << fname << std::endl, command->ShouldBeQuiet());
    bool readit = mf->ReadDependentFile(fname.c_str());
    if(!readit)
      {
      std::string m = "Could not find include file: ";
      m += fname;
      command->SetError(m);
      return false;
      }
    }
  else
    {
    cmCTestOptionalLog(this, WARNING,
      "Cannot locate CTest configuration: in BuildDirectory: "
      << bld_dir_fname << std::endl, command->ShouldBeQuiet());
    cmCTestOptionalLog(this, WARNING,
      "Cannot locate CTest configuration: in SourceDirectory: "
      << src_dir_fname << std::endl, command->ShouldBeQuiet());
    }

  this->SetCTestConfigurationFromCMakeVariable(mf, "NightlyStartTime",
    "CTEST_NIGHTLY_START_TIME", command->ShouldBeQuiet());
  this->SetCTestConfigurationFromCMakeVariable(mf, "Site", "CTEST_SITE",
    command->ShouldBeQuiet());
  this->SetCTestConfigurationFromCMakeVariable(mf, "BuildName",
    "CTEST_BUILD_NAME", command->ShouldBeQuiet());
  const char* dartVersion = mf->GetDefinition("CTEST_DART_SERVER_VERSION");
  if ( dartVersion )
    {
    this->DartVersion = atoi(dartVersion);
    if ( this->DartVersion < 0 )
      {
      cmCTestLog(this, ERROR_MESSAGE, "Invalid Dart server version: "
        << dartVersion << ". Please specify the version number."
        << std::endl);
      return false;
      }
    }
  this->DropSiteCDash = mf->IsOn("CTEST_DROP_SITE_CDASH");

  if ( !this->Initialize(bld_dir.c_str(), command) )
    {
    return false;
    }
  cmCTestOptionalLog(this, OUTPUT, "   Use " << this->GetTestModelString()
    << " tag: " << this->GetCurrentTag() << std::endl,
    command->ShouldBeQuiet());
  return true;
}